

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::ResolveFeaturesImpl<google::protobuf::FieldDescriptor>
          (DescriptorBuilder *this,Edition edition,Proto *proto,FieldDescriptor *descriptor,
          OptionsType *options,FlatAllocator *alloc,ErrorLocation error_location,bool force_merge)

{
  Tables *pTVar1;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  FieldDescriptor *descriptor_00;
  bool bVar2;
  FeatureSet *pFVar3;
  LogMessage *pLVar4;
  FeatureSet *pFVar5;
  size_t sVar6;
  FeatureResolver *this_00;
  string_view element_name;
  anon_class_8_1_60e8d46a local_158;
  VoidPtr local_150;
  Invoker<std::__cxx11::basic_string<char>_> p_Stack_148;
  string_view local_140;
  undefined1 local_130 [8];
  StatusOr<google::protobuf::FeatureSet> merged;
  undefined1 local_b8 [8];
  FeatureSet base_features;
  LogMessage local_60;
  Voidify local_49;
  FeatureSet *local_48;
  FeatureSet *parent_features;
  FlatAllocator *pFStack_38;
  bool force_merge_local;
  FlatAllocator *alloc_local;
  OptionsType *options_local;
  FieldDescriptor *descriptor_local;
  Proto *proto_local;
  DescriptorBuilder *pDStack_10;
  Edition edition_local;
  DescriptorBuilder *this_local;
  
  parent_features._7_1_ = force_merge;
  pFStack_38 = alloc;
  alloc_local = (FlatAllocator *)options;
  options_local = (OptionsType *)descriptor;
  descriptor_local = (FieldDescriptor *)proto;
  proto_local._4_4_ = edition;
  pDStack_10 = this;
  local_48 = anon_unknown_24::GetParentFeatures(descriptor);
  pFVar3 = FeatureSet::default_instance();
  (options_local->field_0)._impl_.edition_defaults_.super_RepeatedPtrFieldBase.tagged_rep_or_elem_ =
       pFVar3;
  pFVar3 = FeatureSet::default_instance();
  *(FeatureSet **)
   &(options_local->field_0)._impl_.edition_defaults_.super_RepeatedPtrFieldBase.current_size_ =
       pFVar3;
  bVar2 = std::optional<google::protobuf::FeatureResolver>::has_value(&this->feature_resolver_);
  base_features.field_0._impl_.default_symbol_visibility_._3_1_ = 0;
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
               ,0x170a,"feature_resolver_.has_value()");
    base_features.field_0._impl_.default_symbol_visibility_._3_1_ = 1;
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_60);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_49,pLVar4);
  }
  if ((base_features.field_0._impl_.default_symbol_visibility_._3_1_ & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_60);
  }
  bVar2 = FieldOptions::has_features((FieldOptions *)alloc_local);
  if (bVar2) {
    pTVar1 = this->tables_;
    pFVar3 = FieldOptions::mutable_features((FieldOptions *)alloc_local);
    pFVar3 = DescriptorPool::Tables::InternFeatureSet(pTVar1,pFVar3);
    (options_local->field_0)._impl_.edition_defaults_.super_RepeatedPtrFieldBase.tagged_rep_or_elem_
         = pFVar3;
    FieldOptions::clear_features((FieldOptions *)alloc_local);
  }
  FeatureSet::FeatureSet
            ((FeatureSet *)local_b8,
             (FeatureSet *)
             (options_local->field_0)._impl_.edition_defaults_.super_RepeatedPtrFieldBase.
             tagged_rep_or_elem_);
  bVar2 = anon_unknown_24::IsLegacyEdition(proto_local._4_4_);
  if ((bVar2) &&
     (pFVar3 = (FeatureSet *)
               (options_local->field_0)._impl_.edition_defaults_.super_RepeatedPtrFieldBase.
               tagged_rep_or_elem_, pFVar5 = FeatureSet::default_instance(), pFVar3 != pFVar5)) {
    element_name = FieldDescriptor::name((FieldDescriptor *)options_local);
    AddError(this,element_name,(Message *)descriptor_local,error_location,
             "Features are only valid under editions.");
  }
  InferLegacyProtoFeatures
            ((FieldDescriptorProto *)descriptor_local,(FieldOptions *)alloc_local,proto_local._4_4_,
             (FeatureSet *)local_b8);
  sVar6 = FeatureSet::ByteSizeLong((FeatureSet *)local_b8);
  if ((sVar6 == 0) && ((parent_features._7_1_ & 1) == 0)) {
    *(FeatureSet **)
     &(options_local->field_0)._impl_.edition_defaults_.super_RepeatedPtrFieldBase.current_size_ =
         local_48;
    merged.super_StatusOrData<google::protobuf::FeatureSet>.field_1._72_4_ = 1;
  }
  else {
    this_00 = std::optional<google::protobuf::FeatureResolver>::operator->(&this->feature_resolver_)
    ;
    FeatureResolver::MergeFeatures
              ((StatusOr<google::protobuf::FeatureSet> *)local_130,this_00,local_48,
               (FeatureSet *)local_b8);
    bVar2 = absl::lts_20250127::StatusOr<google::protobuf::FeatureSet>::ok
                      ((StatusOr<google::protobuf::FeatureSet> *)local_130);
    if (bVar2) {
      pTVar1 = this->tables_;
      pFVar3 = absl::lts_20250127::StatusOr<google::protobuf::FeatureSet>::operator*
                         ((StatusOr<google::protobuf::FeatureSet> *)local_130);
      pFVar3 = DescriptorPool::Tables::InternFeatureSet(pTVar1,pFVar3);
      *(FeatureSet **)
       &(options_local->field_0)._impl_.edition_defaults_.super_RepeatedPtrFieldBase.current_size_ =
           pFVar3;
    }
    else {
      local_140 = FieldDescriptor::name((FieldDescriptor *)options_local);
      descriptor_00 = descriptor_local;
      local_158.merged = (StatusOr<google::protobuf::FeatureSet> *)local_130;
      absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
      FunctionRef<google::protobuf::DescriptorBuilder::ResolveFeaturesImpl<google::protobuf::FieldDescriptor>(google::protobuf::Edition,google::protobuf::FieldDescriptor::Proto_const&,google::protobuf::FieldDescriptor*,google::protobuf::FieldDescriptor::OptionsType*,google::protobuf::internal::FlatAllocator&,google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation,bool)::_lambda()_1_,void>
                ((FunctionRef<std::__cxx11::string()> *)&local_150,&local_158);
      make_error.invoker_ = p_Stack_148;
      make_error.ptr_.obj = local_150.obj;
      AddError(this,local_140,(Message *)descriptor_00,error_location,make_error);
    }
    merged.super_StatusOrData<google::protobuf::FeatureSet>.field_1._73_3_ = 0;
    merged.super_StatusOrData<google::protobuf::FeatureSet>.field_1._72_1_ = !bVar2;
    absl::lts_20250127::StatusOr<google::protobuf::FeatureSet>::~StatusOr
              ((StatusOr<google::protobuf::FeatureSet> *)local_130);
  }
  FeatureSet::~FeatureSet((FeatureSet *)local_b8);
  return;
}

Assistant:

void DescriptorBuilder::ResolveFeaturesImpl(
    Edition edition, const typename DescriptorT::Proto& proto,
    DescriptorT* descriptor, typename DescriptorT::OptionsType* options,
    internal::FlatAllocator& alloc,
    DescriptorPool::ErrorCollector::ErrorLocation error_location,
    bool force_merge) {
  const FeatureSet& parent_features = GetParentFeatures(descriptor);
  descriptor->proto_features_ = &FeatureSet::default_instance();
  descriptor->merged_features_ = &FeatureSet::default_instance();

  ABSL_CHECK(feature_resolver_.has_value());

  if (options->has_features()) {
    // Remove the features from the child's options proto to avoid leaking
    // internal details.
    descriptor->proto_features_ =
        tables_->InternFeatureSet(std::move(*options->mutable_features()));
    options->clear_features();
  }

  FeatureSet base_features = *descriptor->proto_features_;

  // Handle feature inference from proto2/proto3.
  if (IsLegacyEdition(edition)) {
    if (descriptor->proto_features_ != &FeatureSet::default_instance()) {
      AddError(descriptor->name(), proto, error_location,
               "Features are only valid under editions.");
    }
  }
  InferLegacyProtoFeatures(proto, *options, edition, base_features);

  if (base_features.ByteSizeLong() == 0 && !force_merge) {
    // Nothing to merge, and we aren't forcing it.
    descriptor->merged_features_ = &parent_features;
    return;
  }

  // Calculate the merged features for this target.
  absl::StatusOr<FeatureSet> merged =
      feature_resolver_->MergeFeatures(parent_features, base_features);
  if (!merged.ok()) {
    AddError(descriptor->name(), proto, error_location,
             [&] { return std::string(merged.status().message()); });
    return;
  }

  descriptor->merged_features_ = tables_->InternFeatureSet(*std::move(merged));
}